

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTest::DyndepParserTest(DyndepParserTest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Test).failed_ = false;
  (this->super_Test).assertion_failures_ = 0;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DyndepParserTest_001bffd0;
  State::State(&this->state_);
  VirtualFileSystem::VirtualFileSystem(&this->fs_);
  p_Var1 = &(this->dyndep_file_).
            super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->dyndep_file_).
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dyndep_file_).
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dyndep_file_).
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dyndep_file_).
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dyndep_file_).
  super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>.
  _M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void AssertParse(const char* input) {
    DyndepParser parser(&state_, &fs_, &dyndep_file_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
  }